

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

_Bool override_component(ecs_world_t *world,ecs_entity_t component,ecs_type_t type,ecs_data_t *data,
                        ecs_column_t *column,int32_t row,int32_t count)

{
  ulong uVar1;
  _Bool _Var2;
  int32_t iVar3;
  void *pvVar4;
  ecs_entity_t e;
  int32_t type_count;
  int32_t i;
  ecs_entity_t *type_array;
  int32_t row_local;
  ecs_column_t *column_local;
  ecs_data_t *data_local;
  ecs_type_t type_local;
  ecs_entity_t component_local;
  ecs_world_t *world_local;
  
  pvVar4 = _ecs_vector_first(type,8,0x10);
  iVar3 = ecs_vector_count(type);
  e._4_4_ = iVar3 + -1;
  while( true ) {
    uVar1 = *(ulong *)((long)pvVar4 + (long)e._4_4_ * 8);
    if (uVar1 < 0xfd00000000000000) {
      return false;
    }
    if (((uVar1 & 0xff00000000000000) == 0xfe00000000000000) &&
       (_Var2 = override_from_base(world,uVar1 & 0xffffffffffffff,component,data,column,row,count),
       _Var2)) break;
    e._4_4_ = e._4_4_ + -1;
    if (e._4_4_ < 0) {
      return false;
    }
  }
  return true;
}

Assistant:

static
bool override_component(
    ecs_world_t * world,
    ecs_entity_t component,
    ecs_type_t type,
    ecs_data_t * data,
    ecs_column_t * column,
    int32_t row,
    int32_t count)
{
    ecs_entity_t *type_array = ecs_vector_first(type, ecs_entity_t);
    int32_t i, type_count = ecs_vector_count(type);

    /* Walk prefabs */
    i = type_count - 1;
    do {
        ecs_entity_t e = type_array[i];

        if (e < ECS_TYPE_ROLE_START) {
            break;
        }

        if (ECS_HAS_ROLE(e, INSTANCEOF)) {
            if (override_from_base(world, e & ECS_COMPONENT_MASK, component, 
                data, column, row, count))
            {
                return true;
            }
        }
    } while (--i >= 0);

    return false;
}